

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

inform_dist * inform_dist_uniform(size_t n)

{
  inform_dist *piVar1;
  size_t i;
  size_t sVar2;
  
  piVar1 = inform_dist_alloc(n);
  if (piVar1 != (inform_dist *)0x0) {
    piVar1->counts = n;
    for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
      piVar1->histogram[sVar2] = 1;
    }
  }
  return piVar1;
}

Assistant:

inform_dist* inform_dist_uniform(size_t n)
{
    // construct a distribution of the desired size
    inform_dist *dist = inform_dist_alloc(n);
    if (dist != NULL)
    {
        // set the counts to the number of states
        dist->counts = n;
        // set the count for each state to 1
        for (size_t i = 0; i < n; ++i) dist->histogram[i] = 1;
    }
    return dist;
}